

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall TasGrid::GridSequence::write<true>(GridSequence *this,ostream *os)

{
  bool bVar1;
  ostream *os_local;
  GridSequence *this_local;
  
  IO::writeNumbers<true,(TasGrid::IO::IOPad)1,int,int>
            ((ostream *)os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  IO::writeRule<true>(this->rule,(ostream *)os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),(ostream *)os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (!bVar1) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).points,(ostream *)os);
  }
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),(ostream *)os);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
  if (!bVar1) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).needed,(ostream *)os);
  }
  bVar1 = Data2D<double>::empty(&this->surpluses);
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>((bool)((bVar1 ^ 0xffU) & 1),(ostream *)os);
  bVar1 = Data2D<double>::empty(&this->surpluses);
  if (!bVar1) {
    Data2D<double>::writeVector<true,(TasGrid::IO::IOPad)3>(&this->surpluses,(ostream *)os);
  }
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<true>(&(this->super_BaseCanonicalGrid).values,(ostream *)os);
  }
  return;
}

Assistant:

void GridSequence::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_rspace>(os, num_dimensions, num_outputs);
    IO::writeRule<iomode>(rule, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeFlag<iomode, IO::pad_auto>(!surpluses.empty(), os);
    if (!surpluses.empty()) surpluses.writeVector<iomode, IO::pad_line>(os);

    if (num_outputs > 0) values.write<iomode>(os);
}